

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OverlayStack.cpp
# Opt level: O2

void __thiscall cursespp::OverlayStack::Remove(OverlayStack *this,ILayoutPtr *layout)

{
  __normal_iterator<std::shared_ptr<cursespp::ILayout>_*,_std::vector<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>_>
  __position;
  __shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<cursespp::ILayout>*,std::vector<std::shared_ptr<cursespp::ILayout>,std::allocator<std::shared_ptr<cursespp::ILayout>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<cursespp::ILayout>const>>
                         ((this->stack).
                          super__Vector_base<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->stack).
                          super__Vector_base<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,layout);
  if (__position._M_current !=
      (this->stack).
      super__Vector_base<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_28,
               &(__position._M_current)->
                super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>);
    setOverlayStack((ILayoutPtr *)&_Stack_28,(OverlayStack *)0x0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
    std::
    vector<std::shared_ptr<cursespp::ILayout>,_std::allocator<std::shared_ptr<cursespp::ILayout>_>_>
    ::erase(&this->stack,(const_iterator)__position._M_current);
  }
  return;
}

Assistant:

void OverlayStack::Remove(ILayoutPtr layout) {
    auto it = std::find(
        this->stack.begin(),
        this->stack.end(), layout);

    if (it != this->stack.end()) {
        setOverlayStack(*it, nullptr);
        this->stack.erase(it);
    }
}